

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O1

void writeOldRawSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,HighsBasis *basis,
                        HighsSolution *solution)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> use_row_status;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> use_col_status;
  vector<double,_std::allocator<double>_> use_row_dual;
  vector<double,_std::allocator<double>_> use_col_dual;
  vector<double,_std::allocator<double>_> use_row_value;
  vector<double,_std::allocator<double>_> use_col_value;
  stringstream ss;
  string local_2b0;
  FILE *local_290;
  HighsLogOptions *local_288;
  HighsLp *local_280;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_278;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_258;
  vector<double,_std::allocator<double>_> local_238;
  vector<double,_std::allocator<double>_> local_218;
  vector<double,_std::allocator<double>_> local_1f8;
  vector<double,_std::allocator<double>_> local_1d8;
  undefined1 local_1b8 [24];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  bVar3 = solution->value_valid;
  bVar4 = solution->dual_valid;
  bVar5 = basis->valid;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_258.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290 = file;
  local_288 = log_options;
  local_280 = lp;
  if (bVar3 == true) {
    std::vector<double,_std::allocator<double>_>::operator=(&local_1d8,&solution->col_value);
    std::vector<double,_std::allocator<double>_>::operator=(&local_1f8,&solution->row_value);
  }
  if (bVar4 != false) {
    std::vector<double,_std::allocator<double>_>::operator=(&local_218,&solution->col_dual);
    std::vector<double,_std::allocator<double>_>::operator=(&local_238,&solution->row_dual);
  }
  if (bVar5 != false) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (&local_258,&basis->col_status);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (&local_278,&basis->row_status);
  }
  if (((bVar3 | bVar4 | bVar5) & 1U) != 0) {
    highsFormatToString_abi_cxx11_
              ((string *)local_1b8,
               "%d %d : Number of columns and rows for primal or dual solution or basis\n",
               (ulong)(uint)local_280->num_col_,(ulong)(uint)local_280->num_row_);
    highsFprintfString(local_290,local_288,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    paVar1 = &local_2b0.field_2;
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str(local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (bVar3 == false) {
      highsFormatToString_abi_cxx11_(&local_2b0,"F");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),local_2b0._M_dataplus._M_p,local_2b0._M_string_length
                );
    }
    else {
      highsFormatToString_abi_cxx11_(&local_2b0,"T");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),local_2b0._M_dataplus._M_p,local_2b0._M_string_length
                );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_2b0," Primal solution\n");
    poVar2 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(local_290,local_288,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str(local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (bVar4 == false) {
      highsFormatToString_abi_cxx11_(&local_2b0,"F");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_2b0,"T");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_2b0," Dual solution\n");
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(local_290,local_288,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str(local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (bVar5 == false) {
      highsFormatToString_abi_cxx11_(&local_2b0,"F");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_2b0,"T");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_2b0," Basis\n");
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(local_290,local_288,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Columns\n","");
    highsFprintfString(local_290,local_288,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (0 < local_280->num_col_) {
      lVar6 = 0;
      do {
        local_2b0._M_string_length = 0;
        local_2b0.field_2._M_local_buf[0] = '\0';
        local_2b0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if (bVar3 != false) {
          highsFormatToString_abi_cxx11_
                    (&local_2b0,"%.15g ",
                     SUB84(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6],0));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
        }
        if (bVar4 != false) {
          highsFormatToString_abi_cxx11_
                    (&local_2b0,"%.15g ",
                     SUB84(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6],0));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
        }
        if (bVar5 != false) {
          highsFormatToString_abi_cxx11_
                    (&local_2b0,"%d",
                     (ulong)local_258.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar6]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
        }
        highsFormatToString_abi_cxx11_(&local_2b0,"\n");
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        std::__cxx11::stringbuf::str();
        highsFprintfString(local_290,local_288,&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_280->num_col_);
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Rows\n","");
    highsFprintfString(local_290,local_288,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (0 < local_280->num_row_) {
      lVar6 = 0;
      do {
        local_2b0._M_string_length = 0;
        local_2b0.field_2._M_local_buf[0] = '\0';
        local_2b0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if (bVar3 != false) {
          highsFormatToString_abi_cxx11_
                    (&local_2b0,"%.15g ",
                     SUB84(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6],0));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
        }
        if (bVar4 != false) {
          highsFormatToString_abi_cxx11_
                    (&local_2b0,"%.15g ",
                     SUB84(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6],0));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
        }
        if (bVar5 != false) {
          highsFormatToString_abi_cxx11_
                    (&local_2b0,"%d",
                     (ulong)local_278.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar6]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
        }
        highsFormatToString_abi_cxx11_(&local_2b0,"\n");
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        std::__cxx11::stringbuf::str();
        highsFprintfString(local_290,local_288,&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_280->num_row_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_278.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void writeOldRawSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp, const HighsBasis& basis,
                         const HighsSolution& solution) {
  const bool have_value = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  const bool have_basis = basis.valid;
  vector<double> use_col_value;
  vector<double> use_row_value;
  vector<double> use_col_dual;
  vector<double> use_row_dual;
  vector<HighsBasisStatus> use_col_status;
  vector<HighsBasisStatus> use_row_status;
  if (have_value) {
    use_col_value = solution.col_value;
    use_row_value = solution.row_value;
  }
  if (have_dual) {
    use_col_dual = solution.col_dual;
    use_row_dual = solution.row_dual;
  }
  if (have_basis) {
    use_col_status = basis.col_status;
    use_row_status = basis.row_status;
  }
  if (!have_value && !have_dual && !have_basis) return;
  highsFprintfString(
      file, log_options,
      highsFormatToString(
          "%" HIGHSINT_FORMAT " %" HIGHSINT_FORMAT
          " : Number of columns and rows for primal or dual solution "
          "or basis\n",
          lp.num_col_, lp.num_row_));
  std::stringstream ss;
  ss.str(std::string());
  if (have_value) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Primal solution\n");
  highsFprintfString(file, log_options, ss.str());
  ss.str(std::string());
  if (have_dual) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Dual solution\n");
  highsFprintfString(file, log_options, ss.str());
  ss.str(std::string());
  if (have_basis) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Basis\n");
  highsFprintfString(file, log_options, ss.str());
  highsFprintfString(file, log_options, "Columns\n");
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    ss.str(std::string());
    if (have_value) ss << highsFormatToString("%.15g ", use_col_value[iCol]);
    if (have_dual) ss << highsFormatToString("%.15g ", use_col_dual[iCol]);
    if (have_basis)
      ss << highsFormatToString("%" HIGHSINT_FORMAT "",
                                (HighsInt)use_col_status[iCol]);
    ss << highsFormatToString("\n");
    highsFprintfString(file, log_options, ss.str());
  }
  highsFprintfString(file, log_options, "Rows\n");
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ss.str(std::string());
    if (have_value) ss << highsFormatToString("%.15g ", use_row_value[iRow]);
    if (have_dual) ss << highsFormatToString("%.15g ", use_row_dual[iRow]);
    if (have_basis)
      ss << highsFormatToString("%" HIGHSINT_FORMAT "",
                                (HighsInt)use_row_status[iRow]);
    ss << highsFormatToString("\n");
    highsFprintfString(file, log_options, ss.str());
  }
}